

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

void __thiscall Polymer::CheckAheadRnase(Polymer *this,int old_stop,int new_stop)

{
  int iVar1;
  pointer pIVar2;
  bool bVar3;
  SpeciesTracker *this_00;
  element_type *peVar4;
  BindingSite *this_01;
  Interval<std::shared_ptr<BindingSite>,_unsigned_long> *interval;
  pointer pIVar5;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  
  results.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  results.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  results.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
            (&this->binding_sites_,(long)(old_stop + 1),(long)new_stop,&results);
  pIVar2 = results.
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar5 = results.
                super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pIVar5 != pIVar2; pIVar5 = pIVar5 + 1) {
    peVar4 = (pIVar5->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar4->super_FixedElement).start_ < new_stop) {
      iVar1 = (peVar4->super_FixedElement).covered_;
      (peVar4->super_FixedElement).covered_ = iVar1 + 1;
      if (-1 < iVar1 && (peVar4->super_FixedElement).old_covered_ == 0) {
        LogCover(this,&(peVar4->super_FixedElement).name_);
        peVar4 = (pIVar5->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      bVar3 = std::operator!=(&(peVar4->super_FixedElement).gene_,"");
      this_01 = (pIVar5->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (((bVar3) && ((this_01->super_FixedElement).first_exposure_ == true)) &&
         ((this_01->super_FixedElement).field_0x9d == '\0')) {
        this->degraded_elements_ = this->degraded_elements_ + 1;
        this_00 = SpeciesTracker::Instance();
        SpeciesTracker::IncrementTranscript
                  (this_00,&(((pIVar5->value).
                              super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                            super_FixedElement).gene_,-1);
        this_01 = (pIVar5->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
      }
      BindingSite::Degrade(this_01);
      peVar4 = (pIVar5->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (peVar4->super_FixedElement).old_covered_ = (peVar4->super_FixedElement).covered_;
    }
  }
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector(&results);
  return;
}

Assistant:

void Polymer::CheckAheadRnase(int old_stop, int new_stop) {
  std::vector<Interval<BindingSite::Ptr>> results;
  binding_sites_.findOverlapping(old_stop + 1, new_stop, results);
  for (auto &interval : results) {
    if (interval.value->start() < new_stop) {
      interval.value->Cover();
      if (interval.value->WasCovered()) {
        // Record changes that species was covered
        LogCover(interval.value->name());
      }
      if (interval.value->gene() != "" &&
          interval.value->first_exposure() == true &&
          interval.value->degraded() == false) {
        degraded_elements_ += 1;
        SpeciesTracker::Instance().IncrementTranscript(interval.value->gene(),
                                                       -1);
      }
      interval.value->Degrade();
      interval.value->ResetState();
    }
  }
}